

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calendar.cpp
# Opt level: O2

void __thiscall
icu_63::Calendar::prepareGetActual
          (Calendar *this,UCalendarDateFields field,UBool isMinimum,UErrorCode *status)

{
  UCalendarDaysOfWeek UVar1;
  UCalendarDaysOfWeek value;
  int iVar2;
  _func_int **pp_Var3;
  UCalendarDateFields field_00;
  
  set(this,UCAL_MILLISECONDS_IN_DAY,0);
  switch(field) {
  case UCAL_MONTH:
switchD_001ff3d1_caseD_2:
    pp_Var3 = (this->super_UObject)._vptr_UObject;
    field_00 = UCAL_DATE;
    goto LAB_001ff44f;
  case UCAL_WEEK_OF_YEAR:
  case UCAL_WEEK_OF_MONTH:
    value = this->fFirstDayOfWeek;
    if (isMinimum != '\0') {
      UVar1 = (int)(this->fFirstDayOfWeek + UCAL_FRIDAY) % 7;
      value = UVar1 + UCAL_SATURDAY;
      if (0 < (int)UVar1) {
        value = UVar1;
      }
    }
    field_00 = UCAL_DAY_OF_WEEK;
    break;
  case UCAL_DATE:
  case UCAL_DAY_OF_YEAR:
  case UCAL_DAY_OF_WEEK:
    goto switchD_001ff3d1_caseD_5;
  case UCAL_DAY_OF_WEEK_IN_MONTH:
    set(this,UCAL_DATE,1);
    field_00 = UCAL_DAY_OF_WEEK;
    value = get(this,UCAL_DAY_OF_WEEK,status);
    break;
  default:
    if (field == UCAL_YEAR_WOY) {
      iVar2 = (*(this->super_UObject)._vptr_UObject[0x12])(this,3);
      set(this,UCAL_WEEK_OF_YEAR,iVar2);
      goto switchD_001ff3d1_caseD_2;
    }
    if (field != UCAL_EXTENDED_YEAR) goto switchD_001ff3d1_caseD_5;
  case UCAL_YEAR:
    pp_Var3 = (this->super_UObject)._vptr_UObject;
    field_00 = UCAL_DAY_OF_YEAR;
LAB_001ff44f:
    value = (*pp_Var3[0x12])(this,(ulong)field_00);
  }
  set(this,field_00,value);
switchD_001ff3d1_caseD_5:
  iVar2 = (*(this->super_UObject)._vptr_UObject[0x12])(this,field);
  set(this,field,iVar2);
  return;
}

Assistant:

void Calendar::prepareGetActual(UCalendarDateFields field, UBool isMinimum, UErrorCode &status)
{
    set(UCAL_MILLISECONDS_IN_DAY, 0);

    switch (field) {
    case UCAL_YEAR:
    case UCAL_EXTENDED_YEAR:
        set(UCAL_DAY_OF_YEAR, getGreatestMinimum(UCAL_DAY_OF_YEAR));
        break;

    case UCAL_YEAR_WOY:
        set(UCAL_WEEK_OF_YEAR, getGreatestMinimum(UCAL_WEEK_OF_YEAR));
        U_FALLTHROUGH;
    case UCAL_MONTH:
        set(UCAL_DATE, getGreatestMinimum(UCAL_DATE));
        break;

    case UCAL_DAY_OF_WEEK_IN_MONTH:
        // For dowim, the maximum occurs for the DOW of the first of the
        // month.
        set(UCAL_DATE, 1);
        set(UCAL_DAY_OF_WEEK, get(UCAL_DAY_OF_WEEK, status)); // Make this user set
        break;

    case UCAL_WEEK_OF_MONTH:
    case UCAL_WEEK_OF_YEAR:
        // If we're counting weeks, set the day of the week to either the
        // first or last localized DOW.  We know the last week of a month
        // or year will contain the first day of the week, and that the
        // first week will contain the last DOW.
        {
            int32_t dow = fFirstDayOfWeek;
            if (isMinimum) {
                dow = (dow + 6) % 7; // set to last DOW
                if (dow < UCAL_SUNDAY) {
                    dow += 7;
                }
            }
#if defined (U_DEBUG_CAL)
            fprintf(stderr, "prepareGetActualHelper(WOM/WOY) - dow=%d\n", dow);
#endif
            set(UCAL_DAY_OF_WEEK, dow);
        }
        break;
    default:
        break;
    }

    // Do this last to give it the newest time stamp
    set(field, getGreatestMinimum(field));
}